

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

double VP8LHistogramEstimateBits(VP8LHistogram *p)

{
  long *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  uint32_t *unaff_retaddr;
  int in_stack_0000000c;
  uint32_t *in_stack_00000010;
  
  VP8LHistogramNumCodes((int)in_RDI[0x195]);
  dVar1 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar2 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar3 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar4 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar5 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  dVar6 = (*VP8LExtraCost)((uint32_t *)(*in_RDI + 0x400),0x18);
  dVar7 = (*VP8LExtraCost)((uint32_t *)(in_RDI + 0x181),0x28);
  return dVar1 + dVar2 + dVar3 + dVar4 + dVar5 + dVar6 + dVar7;
}

Assistant:

double VP8LHistogramEstimateBits(VP8LHistogram* const p) {
  return
      PopulationCost(p->literal_, VP8LHistogramNumCodes(p->palette_code_bits_),
                     NULL, &p->is_used_[0])
      + PopulationCost(p->red_, NUM_LITERAL_CODES, NULL, &p->is_used_[1])
      + PopulationCost(p->blue_, NUM_LITERAL_CODES, NULL, &p->is_used_[2])
      + PopulationCost(p->alpha_, NUM_LITERAL_CODES, NULL, &p->is_used_[3])
      + PopulationCost(p->distance_, NUM_DISTANCE_CODES, NULL, &p->is_used_[4])
      + VP8LExtraCost(p->literal_ + NUM_LITERAL_CODES, NUM_LENGTH_CODES)
      + VP8LExtraCost(p->distance_, NUM_DISTANCE_CODES);
}